

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O1

void __thiscall
ProblemTest_CompareCommonExprs_Test::~ProblemTest_CompareCommonExprs_Test
          (ProblemTest_CompareCommonExprs_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ProblemTest, CompareCommonExprs) {
  Problem p;
  p.AddCommonExpr(mp::NumericExpr());
  p.AddCommonExpr(mp::NumericExpr());
  EXPECT_TRUE(p.common_expr(0) == p.common_expr(0));
  EXPECT_TRUE(p.common_expr(0) != p.common_expr(1));
  EXPECT_FALSE(p.common_expr(0) != p.common_expr(0));
  EXPECT_FALSE(p.common_expr(0) == p.common_expr(1));
}